

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::FixupOutPolygon(Clipper *this,OutRec *outRec)

{
  OutPt *pOVar1;
  bool bVar2;
  OutPt *pOVar3;
  OutPt *pOVar4;
  OutPt *tmpPp;
  OutPt *pp;
  OutPt *pOVar5;
  
  pOVar5 = outRec->bottomPt;
  outRec->pts = pOVar5;
  pOVar3 = pOVar5->prev;
  if (pOVar3 != pOVar5) {
    pOVar4 = (OutPt *)0x0;
    pp = pOVar5;
    do {
      pOVar1 = pp->next;
      pOVar5 = pp;
      if (pOVar3 == pOVar1) break;
      if (((pp->pt).Y == (pOVar1->pt).Y && (pp->pt).X == (pOVar1->pt).X) ||
         (bVar2 = SlopesEqual(pOVar3->pt,pp->pt,pOVar1->pt,
                              (bool)(this->_vptr_Clipper[-3] + 0x10)
                                    [(long)&(this->m_PolyOuts).
                                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                    ]), bVar2)) {
        if (pp == outRec->bottomPt) {
          outRec->bottomPt = (OutPt *)0x0;
        }
        pOVar3 = pp->next;
        pp->prev->next = pOVar3;
        pOVar5 = pp->prev;
        pOVar3->prev = pOVar5;
        operator_delete(pp);
        pOVar4 = (OutPt *)0x0;
      }
      else {
        if (pp == pOVar4) {
          if (outRec->bottomPt != (OutPt *)0x0) {
            return;
          }
          pOVar3 = GetBottomPt(pp);
          outRec->bottomPt = pOVar3;
          pOVar3->idx = outRec->idx;
          outRec->pts = outRec->bottomPt;
          return;
        }
        if (pOVar4 == (OutPt *)0x0) {
          pOVar4 = pp;
        }
        pOVar5 = pp->next;
      }
      pOVar3 = pOVar5->prev;
      pp = pOVar5;
    } while (pOVar3 != pOVar5);
  }
  pOVar3->next = (OutPt *)0x0;
  do {
    pOVar3 = pOVar5->next;
    operator_delete(pOVar5);
    pOVar5 = pOVar3;
  } while (pOVar3 != (OutPt *)0x0);
  outRec->pts = (OutPt *)0x0;
  outRec->bottomPt = (OutPt *)0x0;
  return;
}

Assistant:

void Clipper::FixupOutPolygon(OutRec &outRec)
{
  //FixupOutPolygon() - removes duplicate points and simplifies consecutive
  //parallel edges by removing the middle vertex.
  OutPt *lastOK = 0;
  outRec.pts = outRec.bottomPt;
  OutPt *pp = outRec.bottomPt;

  for (;;)
  {
    if (pp->prev == pp || pp->prev == pp->next )
    {
      DisposeOutPts(pp);
      outRec.pts = 0;
      outRec.bottomPt = 0;
      return;
    }
    //test for duplicate points and for same slope (cross-product) ...
    if ( PointsEqual(pp->pt, pp->next->pt) ||
      SlopesEqual(pp->prev->pt, pp->pt, pp->next->pt, m_UseFullRange) )
    {
      lastOK = 0;
      OutPt *tmp = pp;
      if (pp == outRec.bottomPt)
        outRec.bottomPt = 0; //flags need for updating
      pp->prev->next = pp->next;
      pp->next->prev = pp->prev;
      pp = pp->prev;
      delete tmp;
    }
    else if (pp == lastOK) break;
    else
    {
      if (!lastOK) lastOK = pp;
      pp = pp->next;
    }
  }
  if (!outRec.bottomPt) {
    outRec.bottomPt = GetBottomPt(pp);
    outRec.bottomPt->idx = outRec.idx;
    outRec.pts = outRec.bottomPt;
  }
}